

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesFirmwareFlash(zes_firmware_handle_t hFirmware,void *pImage,uint32_t size)

{
  zes_pfnFirmwareFlash_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFirmwareFlash_t pfnFlash;
  uint32_t size_local;
  void *pImage_local;
  zes_firmware_handle_t hFirmware_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Firmware).pfnFlash;
    if (p_Var1 == (zes_pfnFirmwareFlash_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFirmware_local._4_4_ = (*p_Var1)(hFirmware,pImage,size);
    }
  }
  else {
    hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFirmware_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFirmwareFlash(
    zes_firmware_handle_t hFirmware,                ///< [in] Handle for the component.
    void* pImage,                                   ///< [in] Image of the new firmware to flash.
    uint32_t size                                   ///< [in] Size of the flash image.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFirmwareFlash_t pfnFlash = [&result] {
        auto pfnFlash = ze_lib::context->zesDdiTable.load()->Firmware.pfnFlash;
        if( nullptr == pfnFlash ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnFlash;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnFlash( hFirmware, pImage, size );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnFlash = ze_lib::context->zesDdiTable.load()->Firmware.pfnFlash;
    if( nullptr == pfnFlash ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnFlash( hFirmware, pImage, size );
    #endif
}